

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::sync_log_to_new_srv(raft_server *this,ulong start_idx)

{
  _List_iterator<std::shared_ptr<nuraft::srv_config>_> __last;
  const_iterator __position;
  ulong uVar1;
  element_type *peVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  __int_type_conflict3 _Var7;
  element_type *peVar8;
  element_type *peVar9;
  ulong uVar10;
  ulong uVar11;
  element_type *peVar12;
  element_type *peVar13;
  element_type *this_00;
  ulong uVar14;
  unsigned_long *puVar15;
  element_type *this_01;
  size_t sVar16;
  element_type *this_02;
  ulong in_RSI;
  ptr<peer> *in_RDI;
  ulong in_stack_00000168;
  ulong in_stack_00000170;
  ulong in_stack_00000178;
  ptr<peer> *in_stack_00000180;
  raft_server *in_stack_00000188;
  bool *in_stack_000001a0;
  ptr<buffer> log_pack;
  int32 size_to_sync;
  bool succeeded_out;
  ptr<req_msg> req;
  ptr<log_entry> entry;
  ptr<buffer> new_conf_buf;
  ptr<cluster_config> new_conf;
  ptr<cluster_config> cur_conf;
  ptr<raft_params> params;
  ulong gap;
  memory_order __b_1;
  memory_order __b;
  cluster_config *in_stack_fffffffffffffbe8;
  undefined4 uVar17;
  undefined1 __i;
  value_type *__x;
  cluster_config *in_stack_fffffffffffffbf0;
  value_type *in_stack_fffffffffffffbf8;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *in_stack_fffffffffffffc00;
  raft_server *in_stack_fffffffffffffc08;
  msg_type *in_stack_fffffffffffffc10;
  unsigned_long *in_stack_fffffffffffffc18;
  raft_server *in_stack_fffffffffffffc30;
  peer *in_stack_fffffffffffffc38;
  raft_server *in_stack_fffffffffffffc40;
  ptr<peer> *ppVar18;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  _List_iterator<std::shared_ptr<nuraft::srv_config>_> in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  cluster_config *in_stack_fffffffffffffc88;
  ulong local_280;
  rpc_handler *in_stack_fffffffffffffd98;
  ptr<req_msg> *in_stack_fffffffffffffda0;
  peer *in_stack_fffffffffffffdb0;
  undefined1 local_220 [16];
  undefined8 local_210;
  int32 local_208;
  undefined4 local_204;
  ulong local_200;
  string local_1e8 [32];
  undefined1 local_1c8 [16];
  unsigned_long local_1b8;
  uint local_1ac;
  value_type local_191;
  undefined4 local_17c;
  uint64_t local_178;
  undefined1 local_169;
  ulong local_168;
  string local_140 [32];
  _List_node_base *local_120;
  _List_node_base *local_118;
  _List_node_base *local_110;
  iterator local_108;
  _List_const_iterator<std::shared_ptr<nuraft::srv_config>_> local_100;
  ulong local_f8;
  undefined8 local_f0;
  string local_d8 [48];
  string local_a8 [48];
  ulong local_78 [3];
  ptr<req_msg> local_60 [2];
  ulong local_40;
  element_type *local_30;
  memory_order local_28;
  int local_24;
  ptr<peer> *local_20;
  element_type *local_18;
  memory_order local_10;
  int local_c;
  ptr<peer> *local_8;
  
  local_40 = in_RSI;
  bVar3 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &in_RDI[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  if (bVar3) {
    peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x482580);
    iVar5 = (**(code **)(*(long *)peVar9 + 0x38))();
    if (4 < iVar5) {
      in_stack_fffffffffffffd98 =
           (rpc_handler *)
           std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4825a6);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x4825c2);
      uVar4 = peer::get_id((peer *)0x4825ca);
      uVar1 = local_40;
      peVar12 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4825f5);
      uVar6 = (**(code **)(*(long *)peVar12 + 0x18))();
      in_stack_fffffffffffffda0 = local_60;
      msg_if_given_abi_cxx11_
                ((char *)in_stack_fffffffffffffda0,
                 "[SYNC LOG] peer %d start idx %lu, my log start idx %lu",(ulong)uVar4,uVar1,uVar6);
      (**(code **)(*(long *)&(in_stack_fffffffffffffd98->super__Function_base)._M_functor + 0x40))
                (in_stack_fffffffffffffd98,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"sync_log_to_new_srv",0xd8,in_stack_fffffffffffffda0);
      std::__cxx11::string::~string((string *)local_60);
    }
  }
  _Var7 = std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffbf8);
  if (local_40 < _Var7) {
    _Var7 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffbf8);
    local_280 = _Var7 - local_40;
  }
  else {
    local_280 = 0;
  }
  local_78[0] = local_280;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x48270e);
  nuraft::context::get_params((context *)in_stack_fffffffffffffc08);
  peVar8 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x48272b);
  uVar1 = local_78[0];
  if (((0 < *(int *)(peVar8 + 0x14)) &&
      (peVar8 = std::
                __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x48274e), uVar1 < (ulong)(long)*(int *)(peVar8 + 0x14))) ||
     (peVar8 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x48276f), *(int *)(peVar8 + 0x14) == 0)) {
    bVar3 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &in_RDI[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar3) {
      peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4827aa);
      iVar5 = (**(code **)(*(long *)peVar9 + 0x38))();
      if (3 < iVar5) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4827e3);
        uVar17 = (undefined4)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x4827ff);
        uVar4 = peer::get_id((peer *)0x482807);
        uVar1 = local_78[0];
        ppVar18 = in_RDI + 10;
        local_c = 5;
        local_8 = ppVar18;
        local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_c - 1U < 2) {
          local_18 = (ppVar18->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        }
        else if (local_c == 5) {
          local_18 = (ppVar18->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        }
        else {
          local_18 = (ppVar18->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        }
        peVar2 = local_18;
        peVar8 = std::
                 __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4828f8);
        in_stack_fffffffffffffbe8 =
             (cluster_config *)CONCAT44(uVar17,*(undefined4 *)(peVar8 + 0x14));
        msg_if_given_abi_cxx11_
                  ((char *)local_a8,
                   "[SYNC LOG] LogSync is done for server %d with log gap %lu (%lu - %lu, limit %d), now put the server into cluster"
                   ,(ulong)uVar4,uVar1,peVar2,local_40);
        (**(code **)(*(long *)peVar9 + 0x40))
                  (peVar9,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"sync_log_to_new_srv",0xe6,local_a8);
        std::__cxx11::string::~string(local_a8);
      }
    }
    get_config(in_stack_fffffffffffffc08);
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x39));
    if (bVar3) {
      bVar3 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &in_RDI[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar3) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x482a1e);
        iVar5 = (**(code **)(*(long *)peVar9 + 0x38))();
        if (3 < iVar5) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x482a57);
          peVar13 = std::
                    __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x482a73);
          uVar10 = cluster_config::get_log_idx(peVar13);
          peVar13 = std::
                    __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x482a99);
          uVar11 = cluster_config::get_prev_log_idx(peVar13);
          msg_if_given_abi_cxx11_
                    ((char *)local_d8,"uncommitted config exists at log %lu, prev log %lu",uVar10,
                     uVar11);
          (**(code **)(*(long *)peVar9 + 0x40))
                    (peVar9,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"sync_log_to_new_srv",0xf0,local_d8);
          std::__cxx11::string::~string(local_d8);
        }
      }
      std::shared_ptr<nuraft::cluster_config>::operator=
                ((shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffbf0,
                 (shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffbe8);
    }
    peVar12 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x482b85);
    local_f0 = (**(code **)(*(long *)peVar12 + 0x10))();
    peVar13 = std::
              __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x482bb8);
    local_f8 = cluster_config::get_log_idx(peVar13);
    cs_new<nuraft::cluster_config,unsigned_long,unsigned_long>
              ((unsigned_long *)in_stack_fffffffffffffbf8,&in_stack_fffffffffffffbf0->log_idx_);
    peVar13 = std::
              __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x482c06);
    cluster_config::get_servers_abi_cxx11_(peVar13);
    peVar13 = std::
              __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x482c25);
    cluster_config::get_servers_abi_cxx11_(peVar13);
    local_108._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         ::end((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                *)in_stack_fffffffffffffbe8);
    std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::_List_const_iterator
              (&local_100,&local_108);
    peVar13 = std::
              __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x482c6e);
    cluster_config::get_servers_abi_cxx11_(peVar13);
    local_110 = (_List_node_base *)
                std::__cxx11::
                list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                ::begin((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                         *)in_stack_fffffffffffffbe8);
    peVar13 = std::
              __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x482ca2);
    cluster_config::get_servers_abi_cxx11_(peVar13);
    local_118 = (_List_node_base *)
                std::__cxx11::
                list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                ::end((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                       *)in_stack_fffffffffffffbe8);
    __position._M_node._4_4_ = in_stack_fffffffffffffc5c;
    __position._M_node._0_4_ = in_stack_fffffffffffffc58;
    __last._M_node._4_4_ = in_stack_fffffffffffffc4c;
    __last._M_node._0_4_ = in_stack_fffffffffffffc48;
    local_120 = (_List_node_base *)
                std::__cxx11::
                list<std::shared_ptr<nuraft::srv_config>,std::allocator<std::shared_ptr<nuraft::srv_config>>>
                ::insert<std::_List_iterator<std::shared_ptr<nuraft::srv_config>>,void>
                          ((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                            *)in_stack_fffffffffffffc40,__position,in_stack_fffffffffffffc50,__last)
    ;
    peVar13 = std::
              __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x482d15);
    cluster_config::get_servers_abi_cxx11_(peVar13);
    std::__cxx11::
    list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
    ::push_back(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x482d52);
    std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x482d67);
    cluster_config::get_user_ctx_abi_cxx11_(in_stack_fffffffffffffbe8);
    cluster_config::set_user_ctx(in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8);
    std::__cxx11::string::~string(local_140);
    peVar13 = std::
              __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x482daa);
    this_00 = std::
              __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x482dbf);
    bVar3 = cluster_config::is_async_replication(this_00);
    cluster_config::set_async_replication(peVar13,bVar3);
    std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x482df9);
    cluster_config::serialize(in_stack_fffffffffffffc88);
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x482e1f);
    local_168 = srv_state::get_term((srv_state *)0x482e27);
    local_169 = 2;
    local_178 = timer_helper::get_timeofday_us();
    cs_new<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
              ((unsigned_long *)in_stack_fffffffffffffc08,
               (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffc00,
               (log_val_type *)in_stack_fffffffffffffbf8,&in_stack_fffffffffffffbf0->log_idx_);
    store_log_entry(in_stack_fffffffffffffc40,(ptr<log_entry> *)in_stack_fffffffffffffc38,
                    (ulong)in_stack_fffffffffffffc30);
    *(undefined1 *)
     ((long)&in_RDI[0xe].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi + 1) = 1;
    std::shared_ptr<nuraft::cluster_config>::operator=
              ((shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffbf0,
               (shared_ptr<nuraft::cluster_config> *)in_stack_fffffffffffffbe8);
    request_append_entries(in_stack_fffffffffffffc30);
    local_17c = 1;
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x482efc);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x482f09);
    std::shared_ptr<nuraft::cluster_config>::~shared_ptr
              ((shared_ptr<nuraft::cluster_config> *)0x482f16);
    std::shared_ptr<nuraft::cluster_config>::~shared_ptr
              ((shared_ptr<nuraft::cluster_config> *)0x482f23);
    goto LAB_004836a6;
  }
  std::shared_ptr<nuraft::req_msg>::shared_ptr((shared_ptr<nuraft::req_msg> *)0x482fd1);
  uVar1 = local_40;
  __i = (undefined1)((ulong)in_stack_fffffffffffffbe8 >> 0x38);
  peVar12 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x482ff5);
  uVar14 = (**(code **)(*(long *)peVar12 + 0x18))();
  if (uVar1 < uVar14) {
    std::atomic<bool>::operator=((atomic<bool> *)in_stack_fffffffffffffbf0,(bool)__i);
    local_191.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ = 0;
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x483077);
    srv_state::get_term((srv_state *)0x48307f);
    std::__atomic_base::operator_cast_to_unsigned_long
              ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffbf8);
    __x = &local_191;
    create_sync_snapshot_req
              (in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170,
               in_stack_00000168,in_stack_000001a0);
    std::shared_ptr<nuraft::req_msg>::operator=
              ((shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffffbf0,
               (shared_ptr<nuraft::req_msg> *)__x);
    std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x4830ff);
    if (((byte)local_191.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
        1) != 0) goto LAB_004835ce;
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_fffffffffffffbf0,SUB81((ulong)__x >> 0x38,0));
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffbf0);
    enable_hb_for_peer(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    local_17c = 1;
  }
  else {
    peVar8 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x483183);
    local_1b8 = (unsigned_long)*(int *)(peVar8 + 0x10);
    puVar15 = std::min<unsigned_long>(local_78,&local_1b8);
    local_1ac = (uint)*puVar15;
    peVar12 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4831d3);
    (**(code **)(*(long *)peVar12 + 0x60))(local_1c8,peVar12,local_40,local_1ac);
    bVar3 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &in_RDI[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar3) {
      peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x483229);
      iVar5 = (**(code **)(*(long *)peVar9 + 0x38))();
      if (4 < iVar5) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x483262);
        uVar4 = local_1ac;
        this_01 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x483285);
        sVar16 = nuraft::buffer::size(this_01);
        msg_if_given_abi_cxx11_
                  ((char *)local_1e8,"size to sync: %d, log_pack size %zu\n",(ulong)uVar4,sVar16);
        (**(code **)(*(long *)peVar9 + 0x40))
                  (peVar9,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"sync_log_to_new_srv",0x123,local_1e8);
        std::__cxx11::string::~string(local_1e8);
      }
    }
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x483354);
    local_200 = srv_state::get_term((srv_state *)0x48335c);
    local_204 = 10;
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x48339b);
    local_208 = peer::get_id((peer *)0x4833a3);
    local_210._0_1_ = false;
    local_210._1_7_ = 0;
    local_220._8_8_ = local_40 - 1;
    ppVar18 = in_RDI + 10;
    local_24 = 5;
    local_20 = ppVar18;
    local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (local_24 - 1U < 2) {
      local_30 = (ppVar18->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else if (local_24 == 5) {
      local_30 = (ppVar18->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      local_30 = (ppVar18->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    local_220._0_8_ = local_30;
    in_stack_fffffffffffffbf0 = (cluster_config *)local_220;
    __x = (value_type *)(local_220 + 8);
    cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int,long,unsigned_long,unsigned_long>
              (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,(int *)in_stack_fffffffffffffc08,
               (int *)in_stack_fffffffffffffc00,(long *)in_stack_fffffffffffffbf8,
               (unsigned_long *)in_stack_fffffffffffffc30,(unsigned_long *)in_stack_fffffffffffffc38
              );
    std::shared_ptr<nuraft::req_msg>::operator=
              ((shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffffbf0,
               (shared_ptr<nuraft::req_msg> *)__x);
    std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x4834f3);
    this_02 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4834fd);
    req_msg::log_entries(this_02);
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x483520);
    srv_state::get_term((srv_state *)0x483528);
    cs_new<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
              ((unsigned_long *)in_stack_fffffffffffffbf8,
               (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffbf0,(log_val_type *)__x);
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 *)in_stack_fffffffffffffbf0,__x);
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x48358c);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x483599);
LAB_004835ce:
    peVar8 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4835db);
    if (((byte)peVar8[100] & 1) == 0) {
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x4835fe);
      std::shared_ptr<nuraft::peer>::shared_ptr
                ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffbf0,
                 (shared_ptr<nuraft::peer> *)__x);
      peer::send_req(in_stack_fffffffffffffdb0,in_RDI,in_stack_fffffffffffffda0,
                     in_stack_fffffffffffffd98);
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x48364f);
    }
    else {
      snapshot_io_mgr::instance();
      snapshot_io_mgr::invoke((snapshot_io_mgr *)0x48368a);
    }
    local_17c = 0;
  }
  std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x4836a6);
LAB_004836a6:
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x4836b3);
  return;
}

Assistant:

void raft_server::sync_log_to_new_srv(ulong start_idx) {
    p_db("[SYNC LOG] peer %d start idx %" PRIu64 ", my log start idx %" PRIu64,
         srv_to_join_->get_id(), start_idx, log_store_->start_index());
    // only sync committed logs
    ulong gap = ( quick_commit_index_ > start_idx )
                ? ( quick_commit_index_ - start_idx )
                : 0;
    ptr<raft_params> params = ctx_->get_params();
    if ( ( params->log_sync_stop_gap_ > 0 &&
           gap < (ulong)params->log_sync_stop_gap_ ) ||
         params->log_sync_stop_gap_ == 0 ) {
        p_in( "[SYNC LOG] LogSync is done for server %d "
              "with log gap %" PRIu64 " (%" PRIu64 " - %" PRIu64 ", limit %d), "
              "now put the server into cluster",
              srv_to_join_->get_id(),
              gap, quick_commit_index_.load(), start_idx,
              params->log_sync_stop_gap_ );

        ptr<cluster_config> cur_conf = get_config();

        // WARNING:
        //   If there is any uncommitted changed config,
        //   new config should be generated on top of it.
        if (uncommitted_config_) {
            p_in("uncommitted config exists at log %" PRIu64 ", prev log %" PRIu64,
                 uncommitted_config_->get_log_idx(),
                 uncommitted_config_->get_prev_log_idx());
            cur_conf = uncommitted_config_;
        }

        ptr<cluster_config> new_conf = cs_new<cluster_config>
                                       ( log_store_->next_slot(),
                                         cur_conf->get_log_idx() );
        new_conf->get_servers().insert( new_conf->get_servers().end(),
                                        cur_conf->get_servers().begin(),
                                        cur_conf->get_servers().end() );
        new_conf->get_servers().push_back(conf_to_add_);
        new_conf->set_user_ctx( cur_conf->get_user_ctx() );
        new_conf->set_async_replication
                  ( cur_conf->is_async_replication() );

        ptr<buffer> new_conf_buf(new_conf->serialize());
        ptr<log_entry> entry( cs_new<log_entry>( state_->get_term(),
                                                 new_conf_buf,
                                                 log_val_type::conf,
                                                 timer_helper::get_timeofday_us() ) );
        store_log_entry(entry);
        config_changing_ = true;
        uncommitted_config_ = new_conf;
        request_append_entries();
        return;
    }

    ptr<req_msg> req;

    // Modified by Jung-Sang Ahn, 12/22, 2017.
    // When snapshot transmission is still in progress, start_idx can be 0.
    // We should tolerate this.
    if (/* start_idx > 0 && */ start_idx < log_store_->start_index()) {
        srv_to_join_snp_retry_required_ = false;
        bool succeeded_out = false;
        req = create_sync_snapshot_req( srv_to_join_,
                                        start_idx,
                                        state_->get_term(),
                                        quick_commit_index_,
                                        succeeded_out );
        if (!succeeded_out) {
            // If reading snapshot fails, enable HB temporarily to retry it.
            srv_to_join_snp_retry_required_ = true;
            enable_hb_for_peer(*srv_to_join_);
            return;
        }

    } else {
        int32 size_to_sync = std::min(gap, (ulong)params->log_sync_batch_size_);
        ptr<buffer> log_pack = log_store_->pack(start_idx, size_to_sync);
        p_db( "size to sync: %d, log_pack size %zu\n",
              size_to_sync, log_pack->size() );
        req = cs_new<req_msg>( state_->get_term(),
                               msg_type::sync_log_request,
                               id_,
                               srv_to_join_->get_id(),
                               0L,
                               start_idx - 1,
                               quick_commit_index_.load() );
        req->log_entries().push_back
            ( cs_new<log_entry>
              ( state_->get_term(), log_pack, log_val_type::log_pack) );
    }

    if (!params->use_bg_thread_for_snapshot_io_) {
        // Synchronous IO: directly send here.
        srv_to_join_->send_req(srv_to_join_, req, ex_resp_handler_);
    } else {
        // Asynchronous IO: invoke the thread.
        snapshot_io_mgr::instance().invoke();
    }
}